

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

size_t __thiscall toml::basic_value<toml::type_config>::size(basic_value<toml::type_config> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  long *plVar3;
  size_t sVar4;
  undefined8 *puVar5;
  value_t t;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  source_location local_120;
  source_location local_a8;
  
  vVar2 = this->type_;
  if (vVar2 == string) {
    sVar4 = (this->field_1).string_.value._M_string_length;
  }
  else if (vVar2 == table) {
    sVar4 = *(size_t *)((this->field_1).integer_.value + 0x18);
  }
  else {
    if (vVar2 != array) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0xa0);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"toml::value::size(): bad_cast to container types","");
      source_location::source_location(&local_a8,&this->region_);
      to_string_abi_cxx11_(&local_160,(toml *)(ulong)this->type_,t);
      std::operator+(&local_140,"the actual type is ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160
                    );
      format_error<>(&local_1a0,&local_180,&local_a8,(string *)&local_140);
      source_location::source_location(&local_120,&this->region_);
      *puVar5 = &PTR__type_error_0054b230;
      puVar5[1] = puVar5 + 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) {
        puVar5[3] = CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]);
        puVar5[4] = local_1a0.field_2._8_8_;
      }
      else {
        puVar5[1] = local_1a0._M_dataplus._M_p;
        puVar5[3] = CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]);
      }
      puVar5[2] = local_1a0._M_string_length;
      local_1a0._M_string_length = 0;
      local_1a0.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_120.file_name_.field_2;
      *(undefined4 *)(puVar5 + 0xb) = (undefined4)local_120.last_offset_;
      *(undefined4 *)((long)puVar5 + 0x5c) = local_120.last_offset_._4_4_;
      *(undefined4 *)(puVar5 + 0xc) = (undefined4)local_120.length_;
      *(undefined4 *)((long)puVar5 + 100) = local_120.length_._4_4_;
      *(undefined4 *)(puVar5 + 9) = (undefined4)local_120.last_line_;
      *(undefined4 *)((long)puVar5 + 0x4c) = local_120.last_line_._4_4_;
      *(undefined4 *)(puVar5 + 10) = (undefined4)local_120.last_column_;
      *(undefined4 *)((long)puVar5 + 0x54) = local_120.last_column_._4_4_;
      *(undefined4 *)(puVar5 + 7) = (undefined4)local_120.first_column_;
      *(undefined4 *)((long)puVar5 + 0x3c) = local_120.first_column_._4_4_;
      *(undefined4 *)(puVar5 + 8) = (undefined4)local_120.first_offset_;
      *(undefined4 *)((long)puVar5 + 0x44) = local_120.first_offset_._4_4_;
      puVar5[5] = local_120._0_8_;
      puVar5[6] = local_120.first_line_;
      puVar5[0xd] = puVar5 + 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.file_name_._M_dataplus._M_p == paVar1) {
        puVar5[0xf] = CONCAT71(local_120.file_name_.field_2._M_allocated_capacity._1_7_,
                               local_120.file_name_.field_2._M_local_buf[0]);
        puVar5[0x10] = local_120.file_name_.field_2._8_8_;
      }
      else {
        puVar5[0xd] = local_120.file_name_._M_dataplus._M_p;
        puVar5[0xf] = CONCAT71(local_120.file_name_.field_2._M_allocated_capacity._1_7_,
                               local_120.file_name_.field_2._M_local_buf[0]);
      }
      puVar5[0xe] = local_120.file_name_._M_string_length;
      local_120.file_name_._M_string_length = 0;
      local_120.file_name_.field_2._M_local_buf[0] = '\0';
      puVar5[0x11] = local_120.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      puVar5[0x12] = local_120.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      puVar5[0x13] = local_120.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_120.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_120.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_120.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      local_120.file_name_._M_dataplus._M_p = (pointer)paVar1;
      __cxa_throw(puVar5,&type_error::typeinfo,type_error::~type_error);
    }
    plVar3 = (long *)(this->field_1).integer_.value;
    sVar4 = (plVar3[1] - *plVar3 >> 3) * -0x70a3d70a3d70a3d7;
  }
  return sVar4;
}

Assistant:

std::size_t size() const
    {
        switch(this->type_)
        {
            case value_t::array:
            {
                return this->as_array(std::nothrow).size();
            }
            case value_t::table:
            {
                return this->as_table(std::nothrow).size();
            }
            case value_t::string:
            {
                return this->as_string(std::nothrow).size();
            }
            default:
            {
                throw type_error(format_error(
                    "toml::value::size(): bad_cast to container types",
                    this->location(),
                    "the actual type is " + to_string(this->type_)
                    ), this->location());
            }
        }
    }